

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::OpenPopupEx(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  ImVec2 IVar5;
  ImGuiPopupData *pIVar6;
  ImGuiContext *pIVar7;
  int iVar8;
  ImVec2 *pIVar9;
  ImGuiPopupData *pIVar10;
  int iVar11;
  int iVar12;
  ImGuiContext *g;
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  iVar11 = (GImGui->BeginPopupStack).Size;
  if (((popup_flags & 0x20U) == 0) || ((GImGui->OpenPopupStack).Size <= iVar11)) {
    local_38.x = 0.0;
    local_38.y = 0.0;
    pIVar4 = GImGui->NavWindow;
    iVar2 = GImGui->FrameCount;
    uVar3 = (GImGui->CurrentWindow->IDStack).Data[(long)(GImGui->CurrentWindow->IDStack).Size + -1];
    local_38 = NavCalcPreferredRefPos();
    pIVar9 = &(pIVar7->IO).MousePos;
    if ((pIVar7->IO).MousePos.y < -256000.0 || (pIVar7->IO).MousePos.x < -256000.0) {
      pIVar9 = &local_38;
    }
    IVar5 = *pIVar9;
    if ((pIVar7->DebugLogFlags & 4) != 0) {
      DebugLog("[popup] OpenPopupEx(0x%08X)\n");
    }
    iVar8 = (pIVar7->OpenPopupStack).Size;
    if (iVar11 < iVar8) {
      pIVar10 = (pIVar7->OpenPopupStack).Data;
      if ((pIVar10[iVar11].PopupId == id) &&
         (pIVar10[iVar11].OpenFrameCount == pIVar7->FrameCount + -1)) {
        pIVar10[iVar11].OpenFrameCount = iVar2;
        return;
      }
      ClosePopupToLevel(iVar11,false);
      iVar8 = (pIVar7->OpenPopupStack).Size;
    }
    if (iVar8 == (pIVar7->OpenPopupStack).Capacity) {
      if (iVar8 == 0) {
        iVar11 = 8;
      }
      else {
        iVar11 = iVar8 / 2 + iVar8;
      }
      iVar12 = iVar8 + 1;
      if (iVar8 + 1 < iVar11) {
        iVar12 = iVar11;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar10 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)((long)iVar12 * 0x38,GImAllocatorUserData)
      ;
      pIVar6 = (pIVar7->OpenPopupStack).Data;
      if (pIVar6 != (ImGuiPopupData *)0x0) {
        memcpy(pIVar10,pIVar6,(long)(pIVar7->OpenPopupStack).Size * 0x38);
        pIVar6 = (pIVar7->OpenPopupStack).Data;
        if ((pIVar6 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      }
      (pIVar7->OpenPopupStack).Data = pIVar10;
      (pIVar7->OpenPopupStack).Capacity = iVar12;
      iVar8 = (pIVar7->OpenPopupStack).Size;
    }
    else {
      pIVar10 = (pIVar7->OpenPopupStack).Data;
    }
    pIVar10[iVar8].PopupId = id;
    *(undefined8 *)&pIVar10[iVar8].field_0x4 = 0;
    *(undefined4 *)((long)&pIVar10[iVar8].Window + 4) = 0;
    pIVar10[iVar8].BackupNavWindow = pIVar4;
    pIVar10[iVar8].ParentNavLayer = -1;
    pIVar10[iVar8].OpenFrameCount = iVar2;
    pIVar10[iVar8].OpenParentId = uVar3;
    pIVar10[iVar8].OpenPopupPos = local_38;
    pIVar10[iVar8].OpenMousePos = IVar5;
    *(undefined4 *)&pIVar10[iVar8].field_0x34 = 0;
    (pIVar7->OpenPopupStack).Size = (pIVar7->OpenPopupStack).Size + 1;
  }
  return;
}

Assistant:

void ImGui::OpenPopupEx(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;
    const int current_stack_size = g.BeginPopupStack.Size;

    if (popup_flags & ImGuiPopupFlags_NoOpenOverExistingPopup)
        if (IsPopupOpen(0u, ImGuiPopupFlags_AnyPopupId))
            return;

    ImGuiPopupData popup_ref; // Tagged as new ref as Window will be set back to NULL if we write this into OpenPopupStack.
    popup_ref.PopupId = id;
    popup_ref.Window = NULL;
    popup_ref.BackupNavWindow = g.NavWindow;            // When popup closes focus may be restored to NavWindow (depend on window type).
    popup_ref.OpenFrameCount = g.FrameCount;
    popup_ref.OpenParentId = parent_window->IDStack.back();
    popup_ref.OpenPopupPos = NavCalcPreferredRefPos();
    popup_ref.OpenMousePos = IsMousePosValid(&g.IO.MousePos) ? g.IO.MousePos : popup_ref.OpenPopupPos;

    IMGUI_DEBUG_LOG_POPUP("[popup] OpenPopupEx(0x%08X)\n", id);
    if (g.OpenPopupStack.Size < current_stack_size + 1)
    {
        g.OpenPopupStack.push_back(popup_ref);
    }
    else
    {
        // Gently handle the user mistakenly calling OpenPopup() every frame. It is a programming mistake! However, if we were to run the regular code path, the ui
        // would become completely unusable because the popup will always be in hidden-while-calculating-size state _while_ claiming focus. Which would be a very confusing
        // situation for the programmer. Instead, we silently allow the popup to proceed, it will keep reappearing and the programming error will be more obvious to understand.
        if (g.OpenPopupStack[current_stack_size].PopupId == id && g.OpenPopupStack[current_stack_size].OpenFrameCount == g.FrameCount - 1)
        {
            g.OpenPopupStack[current_stack_size].OpenFrameCount = popup_ref.OpenFrameCount;
        }
        else
        {
            // Close child popups if any, then flag popup for open/reopen
            ClosePopupToLevel(current_stack_size, false);
            g.OpenPopupStack.push_back(popup_ref);
        }

        // When reopening a popup we first refocus its parent, otherwise if its parent is itself a popup it would get closed by ClosePopupsOverWindow().
        // This is equivalent to what ClosePopupToLevel() does.
        //if (g.OpenPopupStack[current_stack_size].PopupId == id)
        //    FocusWindow(parent_window);
    }
}